

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IsRowid(char *z)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    bVar1 = z[lVar2];
    if (bVar1 == "_ROWID_"[lVar2]) {
      if ((ulong)bVar1 == 0) {
        return 1;
      }
    }
    else if (""[bVar1] != ""[(byte)"_ROWID_"[lVar2]]) {
      lVar2 = 0;
      do {
        bVar1 = z[lVar2];
        if (bVar1 == " WITHOUT ROWID"[lVar2 + 9]) {
          if ((ulong)bVar1 == 0) {
            return 1;
          }
        }
        else if (""[bVar1] != ""[(byte)" WITHOUT ROWID"[lVar2 + 9]]) {
          lVar2 = 0;
          do {
            bVar1 = z[lVar2];
            if (bVar1 == "OID"[lVar2]) {
              if ((ulong)bVar1 == 0) {
                return 1;
              }
            }
            else if (""[bVar1] != ""[(byte)"OID"[lVar2]]) {
              return 0;
            }
            lVar2 = lVar2 + 1;
          } while( true );
        }
        lVar2 = lVar2 + 1;
      } while( true );
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3IsRowid(const char *z){
  if( sqlite3StrICmp(z, "_ROWID_")==0 ) return 1;
  if( sqlite3StrICmp(z, "ROWID")==0 ) return 1;
  if( sqlite3StrICmp(z, "OID")==0 ) return 1;
  return 0;
}